

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O1

void lrot32(void *blob,int len,int c)

{
  uint uVar1;
  undefined4 uVar2;
  bool bVar3;
  byte bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  undefined1 (*pauVar10) [64];
  uint uVar11;
  int iVar12;
  int nbytes;
  int iVar13;
  ulong uVar14;
  ushort uVar15;
  ulong uVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  
  iVar9 = len + 3;
  if (-1 < len) {
    iVar9 = len;
  }
  if (c != 0) {
    iVar9 = iVar9 >> 2;
    iVar13 = c + 0x1f;
    if (-1 < c) {
      iVar13 = c;
    }
    if (0x1f < c) {
      uVar1 = iVar9 - 1;
      uVar11 = 1;
      if ((int)uVar1 < 1) {
        uVar11 = uVar1;
      }
      auVar17 = vpbroadcastq_avx512f();
      iVar12 = 0;
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        uVar2 = *(undefined4 *)((long)blob + (long)(int)uVar1 * 4);
        if (7 < len) {
          uVar14 = 0;
          pauVar10 = (undefined1 (*) [64])((long)blob + (ulong)uVar1 * 4 + -0x3c);
          do {
            auVar20 = vpbroadcastq_avx512f();
            auVar21 = vporq_avx512f(auVar20,auVar18);
            auVar20 = vporq_avx512f(auVar20,auVar19);
            uVar5 = vpcmpuq_avx512f(auVar20,auVar17,2);
            uVar6 = vpcmpuq_avx512f(auVar21,auVar17,2);
            auVar20 = vpmovm2d_avx512dq((ulong)CONCAT11((char)uVar6,(char)uVar5));
            auVar20 = vpshufd_avx512f(auVar20,0x1b);
            auVar20 = vshufi64x2_avx512f(auVar20,auVar20,0x1b);
            uVar16 = vpmovd2m_avx512dq(auVar20);
            auVar20 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pauVar10[-1] + 0x3c));
            auVar21._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar20._4_4_;
            auVar21._0_4_ = (uint)((byte)uVar16 & 1) * auVar20._0_4_;
            auVar21._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar20._8_4_;
            auVar21._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar20._12_4_;
            auVar21._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar20._16_4_;
            auVar21._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar20._20_4_;
            auVar21._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar20._24_4_;
            auVar21._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar20._28_4_;
            auVar21._32_4_ = (uint)((byte)(uVar16 >> 8) & 1) * auVar20._32_4_;
            auVar21._36_4_ = (uint)((byte)(uVar16 >> 9) & 1) * auVar20._36_4_;
            auVar21._40_4_ = (uint)((byte)(uVar16 >> 10) & 1) * auVar20._40_4_;
            auVar21._44_4_ = (uint)((byte)(uVar16 >> 0xb) & 1) * auVar20._44_4_;
            auVar21._48_4_ = (uint)((byte)(uVar16 >> 0xc) & 1) * auVar20._48_4_;
            auVar21._52_4_ = (uint)((byte)(uVar16 >> 0xd) & 1) * auVar20._52_4_;
            auVar21._56_4_ = (uint)((byte)(uVar16 >> 0xe) & 1) * auVar20._56_4_;
            auVar21._60_4_ = (uint)((byte)(uVar16 >> 0xf) & 1) * auVar20._60_4_;
            auVar20 = vmovdqu32_avx512f(auVar21);
            *pauVar10 = auVar20;
            uVar14 = uVar14 + 0x10;
            pauVar10 = pauVar10 + -1;
          } while (((ulong)(~uVar11 + iVar9) + 0x10 & 0x1fffffff0) != uVar14);
        }
        *(undefined4 *)blob = uVar2;
        iVar12 = iVar12 + 1;
      } while (iVar12 != iVar13 >> 5);
    }
    if (3 < len && (c & 0x1fU) != 0) {
      auVar17 = vpbroadcastq_avx512f();
      auVar18 = vpaddq_avx512f(auVar17,_DAT_001a3fc0);
      auVar19 = vpaddq_avx512f(auVar17,_DAT_001a4000);
      auVar20 = vpbroadcastd_avx512f(ZEXT416(*(uint *)((long)blob + (long)iVar9 * 4 + -4)));
      auVar21 = vpbroadcastd_avx512f();
      pauVar10 = (undefined1 (*) [64])((long)blob + (ulong)(iVar9 - 1) * 4 + -0x3c);
      uVar14 = 0;
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar24 = vpbroadcastq_avx512f(ZEXT816(0xfffffffffffffff0));
      do {
        auVar25 = vpbroadcastq_avx512f();
        auVar26 = vporq_avx512f(auVar25,auVar22);
        auVar25 = vporq_avx512f(auVar25,auVar23);
        uVar5 = vpcmpuq_avx512f(auVar25,auVar17,2);
        uVar6 = vpcmpuq_avx512f(auVar26,auVar17,2);
        uVar15 = CONCAT11((char)uVar6,(char)uVar5);
        auVar25 = vpmovm2d_avx512dq((ulong)uVar15);
        auVar25 = vpshufd_avx512f(auVar25,0x1b);
        auVar25 = vshufi64x2_avx512f(auVar25,auVar25,0x1b);
        uVar16 = vpmovd2m_avx512dq(auVar25);
        auVar25 = vmovdqu32_avx512f(*pauVar10);
        auVar26._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar25._4_4_;
        auVar26._0_4_ = (uint)((byte)uVar16 & 1) * auVar25._0_4_;
        auVar26._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar25._8_4_;
        auVar26._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar25._12_4_;
        auVar26._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar25._16_4_;
        auVar26._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar25._20_4_;
        auVar26._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar25._24_4_;
        auVar26._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar25._28_4_;
        auVar26._32_4_ = (uint)((byte)(uVar16 >> 8) & 1) * auVar25._32_4_;
        auVar26._36_4_ = (uint)((byte)(uVar16 >> 9) & 1) * auVar25._36_4_;
        auVar26._40_4_ = (uint)((byte)(uVar16 >> 10) & 1) * auVar25._40_4_;
        auVar26._44_4_ = (uint)((byte)(uVar16 >> 0xb) & 1) * auVar25._44_4_;
        auVar26._48_4_ = (uint)((byte)(uVar16 >> 0xc) & 1) * auVar25._48_4_;
        auVar26._52_4_ = (uint)((byte)(uVar16 >> 0xd) & 1) * auVar25._52_4_;
        auVar26._56_4_ = (uint)((byte)(uVar16 >> 0xe) & 1) * auVar25._56_4_;
        auVar26._60_4_ = (uint)((byte)(uVar16 >> 0xf) & 1) * auVar25._60_4_;
        auVar25 = vpshufd_avx512f(auVar26,0x1b);
        auVar25 = vshufi64x2_avx512f(auVar25,auVar25,0x1b);
        uVar7 = vptestnmq_avx512f(auVar19,auVar19);
        uVar8 = vptestnmq_avx512f(auVar18,auVar18);
        uVar5 = vptestmq_avx512f(auVar19,auVar19);
        uVar6 = vptestmq_avx512f(auVar18,auVar18);
        auVar26 = vpmovm2d_avx512dq((ulong)(uVar15 & CONCAT11((char)uVar6,(char)uVar5)));
        auVar26 = vpshufd_avx512f(auVar26,0x1b);
        auVar26 = vshufi64x2_avx512f(auVar26,auVar26,0x1b);
        uVar16 = vpmovd2m_avx512dq(auVar26);
        auVar26 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pauVar10[-1] + 0x3c));
        auVar27._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar26._4_4_;
        auVar27._0_4_ = (uint)((byte)uVar16 & 1) * auVar26._0_4_;
        auVar27._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar26._8_4_;
        auVar27._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar26._12_4_;
        auVar27._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar26._16_4_;
        auVar27._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar26._20_4_;
        auVar27._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar26._24_4_;
        auVar27._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar26._28_4_;
        auVar27._32_4_ = (uint)((byte)(uVar16 >> 8) & 1) * auVar26._32_4_;
        auVar27._36_4_ = (uint)((byte)(uVar16 >> 9) & 1) * auVar26._36_4_;
        auVar27._40_4_ = (uint)((byte)(uVar16 >> 10) & 1) * auVar26._40_4_;
        auVar27._44_4_ = (uint)((byte)(uVar16 >> 0xb) & 1) * auVar26._44_4_;
        auVar27._48_4_ = (uint)((byte)(uVar16 >> 0xc) & 1) * auVar26._48_4_;
        auVar27._52_4_ = (uint)((byte)(uVar16 >> 0xd) & 1) * auVar26._52_4_;
        auVar27._56_4_ = (uint)((byte)(uVar16 >> 0xe) & 1) * auVar26._56_4_;
        auVar27._60_4_ = (uint)((byte)(uVar16 >> 0xf) & 1) * auVar26._60_4_;
        auVar26 = vpshufd_avx512f(auVar27,0x1b);
        auVar26 = vshufi64x2_avx512f(auVar26,auVar26,0x1b);
        uVar15 = uVar15 & CONCAT11((char)uVar8,(char)uVar7);
        auVar27 = vmovdqa32_avx512f(auVar20);
        bVar3 = (bool)((byte)uVar15 & 1);
        auVar28._0_4_ = (uint)bVar3 * auVar27._0_4_ | (uint)!bVar3 * auVar26._0_4_;
        bVar3 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar28._4_4_ = (uint)bVar3 * auVar27._4_4_ | (uint)!bVar3 * auVar26._4_4_;
        bVar3 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar28._8_4_ = (uint)bVar3 * auVar27._8_4_ | (uint)!bVar3 * auVar26._8_4_;
        bVar3 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar28._12_4_ = (uint)bVar3 * auVar27._12_4_ | (uint)!bVar3 * auVar26._12_4_;
        bVar3 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar28._16_4_ = (uint)bVar3 * auVar27._16_4_ | (uint)!bVar3 * auVar26._16_4_;
        bVar3 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar28._20_4_ = (uint)bVar3 * auVar27._20_4_ | (uint)!bVar3 * auVar26._20_4_;
        bVar3 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar28._24_4_ = (uint)bVar3 * auVar27._24_4_ | (uint)!bVar3 * auVar26._24_4_;
        bVar3 = (bool)((byte)(uVar15 >> 7) & 1);
        auVar28._28_4_ = (uint)bVar3 * auVar27._28_4_ | (uint)!bVar3 * auVar26._28_4_;
        bVar4 = (byte)(uVar15 >> 8);
        auVar28._32_4_ =
             (uint)(bVar4 & 1) * auVar27._32_4_ | (uint)!(bool)(bVar4 & 1) * auVar26._32_4_;
        bVar3 = (bool)(bVar4 >> 1 & 1);
        auVar28._36_4_ = (uint)bVar3 * auVar27._36_4_ | (uint)!bVar3 * auVar26._36_4_;
        bVar3 = (bool)(bVar4 >> 2 & 1);
        auVar28._40_4_ = (uint)bVar3 * auVar27._40_4_ | (uint)!bVar3 * auVar26._40_4_;
        bVar3 = (bool)(bVar4 >> 3 & 1);
        auVar28._44_4_ = (uint)bVar3 * auVar27._44_4_ | (uint)!bVar3 * auVar26._44_4_;
        bVar3 = (bool)(bVar4 >> 4 & 1);
        auVar28._48_4_ = (uint)bVar3 * auVar27._48_4_ | (uint)!bVar3 * auVar26._48_4_;
        bVar3 = (bool)(bVar4 >> 5 & 1);
        auVar28._52_4_ = (uint)bVar3 * auVar27._52_4_ | (uint)!bVar3 * auVar26._52_4_;
        bVar3 = (bool)(bVar4 >> 6 & 1);
        auVar28._56_4_ = (uint)bVar3 * auVar27._56_4_ | (uint)!bVar3 * auVar26._56_4_;
        auVar28._60_4_ =
             (uint)(bVar4 >> 7) * auVar27._60_4_ | (uint)!(bool)(bVar4 >> 7) * auVar26._60_4_;
        auVar25 = vpshldvd_avx512_vbmi2(auVar25,auVar28,auVar21);
        auVar25 = vpshufd_avx512f(auVar25,0x1b);
        auVar25 = vshufi64x2_avx512f(auVar25,auVar25,0x1b);
        auVar25 = vmovdqu32_avx512f(auVar25);
        *pauVar10 = auVar25;
        uVar14 = uVar14 + 0x10;
        auVar19 = vpaddq_avx512f(auVar19,auVar24);
        auVar18 = vpaddq_avx512f(auVar18,auVar24);
        pauVar10 = pauVar10 + -1;
      } while (((ulong)(iVar9 - 1) + 0x10 & 0x1fffffff0) != uVar14);
    }
  }
  return;
}

Assistant:

void lrot32 ( void * blob, int len, int c )
{
  assert((len & 3) == 0);

  int nbytes  = len;
  int ndwords = nbytes/4;

  uint32_t * k = (uint32_t*)blob;

  if(c == 0) return;

  //----------

  int b = c / 32;
  c &= (32-1);

  for(int j = 0; j < b; j++)
  {
    uint32_t t = k[ndwords-1];

    for(int i = ndwords-1; i > 0; i--)
    {
      k[i] = k[i-1];
    }

    k[0] = t;
  }

  uint32_t t = k[ndwords-1];

  if(c == 0) return;

  for(int i = ndwords-1; i >= 0; i--)
  {
    uint32_t a = k[i];
    uint32_t b = (i == 0) ? t : k[i-1];

    k[i] = (a << c) | (b >> (32-c));
  }
}